

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

ON_OBSOLETE_V5_DimExtra * ON_OBSOLETE_V5_DimExtra::Cast(ON_Object *p)

{
  bool bVar1;
  ON_OBSOLETE_V5_DimExtra *local_18;
  ON_Object *p_local;
  
  if ((p == (ON_Object *)0x0) ||
     (bVar1 = ON_Object::IsKindOf(p,&m_ON_OBSOLETE_V5_DimExtra_class_rtti),
     local_18 = (ON_OBSOLETE_V5_DimExtra *)p, !bVar1)) {
    local_18 = (ON_OBSOLETE_V5_DimExtra *)0x0;
  }
  return local_18;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}